

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLUtil.cpp
# Opt level: O0

ByteString * OSSL::grp2ByteString(EC_GROUP *grp)

{
  EC_GROUP *in_RSI;
  ByteString *in_RDI;
  uchar *p;
  ByteString *rv;
  size_t in_stack_ffffffffffffffa8;
  ByteString *in_stack_ffffffffffffffb0;
  uchar *local_30 [3];
  undefined1 local_11;
  EC_GROUP *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  ByteString::ByteString((ByteString *)0x1c3da5);
  if (local_10 != (EC_GROUP *)0x0) {
    i2d_ECPKParameters(local_10,(uchar **)0x0);
    ByteString::resize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_30[0] = ByteString::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    i2d_ECPKParameters(local_10,local_30);
  }
  return in_RDI;
}

Assistant:

ByteString OSSL::grp2ByteString(const EC_GROUP* grp)
{
	ByteString rv;

	if (grp != NULL)
	{
		rv.resize(i2d_ECPKParameters(grp, NULL));
		unsigned char *p = &rv[0];
		i2d_ECPKParameters(grp, &p);
	}

	return rv;
}